

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

treeNode * Executor::idExp(treeNode *node)

{
  AttrKind AVar1;
  pointer pcVar2;
  treeNode *ptVar3;
  float fVar4;
  Var *pVVar5;
  treeNode *ptVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string name;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [12];
  Error in_stack_ffffffffffffff54;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  ptVar6 = node->child[0];
  pcVar2 = (node->child[1]->text)._M_dataplus._M_p;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (node->child[1]->text)._M_string_length);
  ptVar3 = node->child[2];
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_c8,local_c8 + local_c0);
  pVVar5 = getVar(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (ptVar6 == (treeNode *)0x0) {
    if (ptVar3 != (treeNode *)0x0) {
      ptVar6 = (treeNode *)operator_new(0x58);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_c8,local_c8 + local_c0);
      treeNode::treeNode(ptVar6,idExp,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (pVVar5->kind == Decmical) {
        (pVVar5->value).decmical = (pVVar5->value).decmical + 1.0;
      }
      else {
        if (pVVar5->kind != Integer) {
          reportError(in_stack_ffffffffffffff54);
        }
        (pVVar5->value).integer = (pVVar5->value).integer + 1;
      }
      goto LAB_0010a621;
    }
    AVar1 = pVVar5->kind;
    if (AVar1 == Boolean) {
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar5->value).boolean);
      goto LAB_0010a621;
    }
    if (AVar1 == Decmical) {
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar5->value).decmical);
      goto LAB_0010a621;
    }
    if (AVar1 == Integer) {
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar5->value).integer);
      goto LAB_0010a621;
    }
    ptVar6 = (treeNode *)operator_new(0x58);
    paVar8 = &local_a8.field_2;
    pcVar2 = (pVVar5->text)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + (pVVar5->text)._M_string_length);
    treeNode::treeNode(ptVar6,&local_a8);
    _Var7._M_p = local_a8._M_dataplus._M_p;
  }
  else {
    if (pVVar5->kind == Decmical) {
      fVar4 = (pVVar5->value).decmical + 1.0;
    }
    else {
      if (pVVar5->kind != Integer) {
        reportError(in_stack_ffffffffffffff54);
      }
      fVar4 = (float)((pVVar5->value).integer + 1);
    }
    (pVVar5->value).integer = (int)fVar4;
    ptVar6 = (treeNode *)operator_new(0x58);
    paVar8 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_c8,local_c8 + local_c0);
    treeNode::treeNode(ptVar6,idExp,&local_68);
    _Var7._M_p = local_68._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
LAB_0010a621:
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return ptVar6;
}

Assistant:

treeNode* idExp(treeNode* node)
    {
        auto left = node->child[0];
        auto name = node->child[1]->text;
        auto right = node->child[2];
        auto var = getVar(name);
        if(left!=nullptr)
        {
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return new treeNode(ExpKind::idExp,name);
        }
        if(right!=nullptr)
        {
            auto tmp = new treeNode(ExpKind::idExp,name);
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return tmp;
        }

        if(var->kind==AttrKind::Integer)       return new treeNode(var->value.integer);
        else if(var->kind==AttrKind::Decmical) return new treeNode(var->value.decmical);
        else if(var->kind==AttrKind::Boolean)  return new treeNode(var->value.boolean);
        else if(var->kind==AttrKind::Text)     return new treeNode(var->text);
    }